

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getRowName(void *highs,HighsInt row,char *name)

{
  HighsStatus HVar1;
  char *__src;
  char *in_RDX;
  HighsInt retcode;
  string name_v;
  string *name_00;
  HighsInt in_stack_ffffffffffffffb4;
  Highs *in_stack_ffffffffffffffb8;
  string local_38;
  char *local_18;
  
  name_00 = &local_38;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)name_00);
  HVar1 = Highs::getRowName(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,name_00);
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(local_18,__src);
  std::__cxx11::string::~string((string *)&local_38);
  return HVar1;
}

Assistant:

HighsInt Highs_getRowName(const void* highs, const HighsInt row, char* name) {
  std::string name_v;
  HighsInt retcode = (HighsInt)((Highs*)highs)->getRowName(row, name_v);
  strcpy(name, name_v.c_str());
  return retcode;
}